

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

opj_bool jp2_read_jp2h(opj_jp2_t *jp2,opj_cio_t *cio,opj_jp2_color_t *color)

{
  ushort uVar1;
  opj_common_ptr poVar2;
  opj_jp2_color_t *poVar3;
  opj_jp2_t *poVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  opj_jp2_comps_t *poVar8;
  opj_jp2_cmap_comp_t *poVar9;
  opj_jp2_cdef_info_t *poVar10;
  opj_jp2_cdef_t *poVar11;
  uint *puVar12;
  uchar *puVar13;
  opj_jp2_pclr_t *poVar14;
  uchar *puVar15;
  char *pcVar16;
  OPJ_INT32 OVar17;
  opj_common_ptr cinfo;
  uint uVar18;
  long lVar19;
  OPJ_UINT32 OVar20;
  ulong uVar21;
  ulong uVar22;
  opj_jp2_box_t box;
  opj_jp2_box_t box_1;
  opj_jp2_box_t local_74;
  opj_jp2_color_t *local_68;
  uchar *local_60;
  uint local_58;
  int local_54;
  uint local_50;
  opj_jp2_box_t local_4c;
  opj_common_ptr local_40;
  opj_jp2_t *local_38;
  
  poVar2 = jp2->cinfo;
  jp2_read_boxhdr(poVar2,cio,&local_74);
  do {
    if (local_74.type == 0x6a703268) break;
    if (local_74.type == 0x6a703263) {
      pcVar16 = "Expected JP2H Marker\n";
      cinfo = poVar2;
      goto LAB_0012bcf5;
    }
    cio_skip(cio,local_74.length - 8);
    if (cio->end <= cio->bp) {
      return 0;
    }
    jp2_read_boxhdr(poVar2,cio,&local_74);
  } while (local_74.type != 0x6a703268);
  cinfo = jp2->cinfo;
  jp2_read_boxhdr(cinfo,cio,&local_4c);
  if (local_4c.type == 0x69686472) {
    uVar5 = cio_read(cio,4);
    jp2->h = uVar5;
    uVar5 = cio_read(cio,4);
    jp2->w = uVar5;
    uVar5 = cio_read(cio,2);
    jp2->numcomps = uVar5;
    poVar8 = (opj_jp2_comps_t *)malloc((ulong)uVar5 * 0xc);
    jp2->comps = poVar8;
    uVar5 = cio_read(cio,1);
    jp2->bpc = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->C = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->UnkC = uVar5;
    uVar5 = cio_read(cio,1);
    jp2->IPR = uVar5;
    iVar6 = cio_tell(cio);
    if (iVar6 - local_4c.init_pos == local_4c.length) {
      local_54 = local_74.length + local_74.init_pos;
      local_40 = poVar2;
      if (jp2->bpc != 0xff) {
LAB_0012b86f:
        iVar6 = local_54;
        jp2_read_boxhdr(local_40,cio,&local_74);
        iVar7 = cio_tell(cio);
        poVar3 = color;
        poVar4 = jp2;
        if (iVar7 < iVar6) {
          do {
            local_38 = poVar4;
            local_68 = poVar3;
            poVar4 = local_38;
            if ((int)local_74.type < 0x636f6c72) {
              if (local_74.type == 0x63646566) {
                if ((local_38->ignore_pclr_cmap_cdef == 0) &&
                   (color->jp2_cdef == (opj_jp2_cdef_t *)0x0)) {
                  uVar5 = cio_read(cio,2);
                  uVar18 = uVar5 & 0xffff;
                  if (uVar18 != 0) {
                    poVar10 = (opj_jp2_cdef_info_t *)malloc((ulong)(uVar18 * 6));
                    poVar11 = (opj_jp2_cdef_t *)malloc(0x10);
                    color->jp2_cdef = poVar11;
                    poVar11->info = poVar10;
                    poVar11->n = (unsigned_short)uVar5;
                    lVar19 = 0;
                    do {
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar10->cn + lVar19) = (short)uVar5;
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar10->typ + lVar19) = (short)uVar5;
                      uVar5 = cio_read(cio,2);
                      *(short *)((long)&poVar10->asoc + lVar19) = (short)uVar5;
                      lVar19 = lVar19 + 6;
                    } while ((ulong)(uVar18 * 2) * 3 != lVar19);
                    goto LAB_0012ba48;
                  }
                }
LAB_0012ba2a:
                cio_seek(cio,local_74.init_pos + 8);
                OVar20 = local_74.length;
                goto LAB_0012ba43;
              }
              if ((((local_74.type != 0x636d6170) || (local_38->ignore_pclr_cmap_cdef != 0)) ||
                  (poVar14 = color->jp2_pclr, poVar14 == (opj_jp2_pclr_t *)0x0)) ||
                 (poVar14->cmap != (opj_jp2_cmap_comp_t *)0x0)) goto LAB_0012ba2a;
              uVar1 = poVar14->nr_channels;
              poVar9 = (opj_jp2_cmap_comp_t *)malloc((ulong)((uint)uVar1 * 4));
              if (uVar1 != 0) {
                uVar21 = 0;
                do {
                  uVar5 = cio_read(cio,2);
                  poVar9[uVar21].cmp = (unsigned_short)uVar5;
                  uVar5 = cio_read(cio,1);
                  poVar9[uVar21].mtyp = (uchar)uVar5;
                  uVar5 = cio_read(cio,1);
                  poVar9[uVar21].pcol = (uchar)uVar5;
                  uVar21 = uVar21 + 1;
                } while (uVar1 != uVar21);
                poVar14 = color->jp2_pclr;
              }
              poVar14->cmap = poVar9;
            }
            else {
              if (local_74.type == 0x70636c72) {
                if ((local_38->ignore_pclr_cmap_cdef == 0) &&
                   (color->jp2_pclr == (opj_jp2_pclr_t *)0x0)) {
                  uVar5 = cio_read(cio,2);
                  local_50 = uVar5;
                  uVar18 = cio_read(cio,1);
                  local_60 = (uchar *)CONCAT44(local_60._4_4_,uVar18);
                  uVar18 = uVar18 & 0xffff;
                  uVar21 = (ulong)uVar18;
                  local_58 = uVar5 & 0xffff;
                  puVar12 = (uint *)malloc((ulong)(uVar18 * local_58) << 2);
                  puVar15 = (uchar *)malloc(uVar21);
                  puVar13 = (uchar *)malloc(uVar21);
                  poVar14 = (opj_jp2_pclr_t *)malloc(0x28);
                  poVar14->channel_sign = puVar13;
                  poVar14->channel_size = puVar15;
                  poVar14->entries = puVar12;
                  poVar14->nr_entries = (unsigned_short)local_50;
                  poVar14->nr_channels = (unsigned_short)local_60;
                  poVar14->cmap = (opj_jp2_cmap_comp_t *)0x0;
                  color->jp2_pclr = poVar14;
                  if (uVar18 != 0) {
                    uVar22 = 0;
                    do {
                      uVar5 = cio_read(cio,1);
                      puVar15[uVar22] = ((byte)uVar5 & 0x7f) + 1;
                      puVar13[uVar22] = (byte)uVar5 >> 7;
                      uVar22 = uVar22 + 1;
                    } while (uVar21 != uVar22);
                  }
                  color = local_68;
                  if (local_58 != 0) {
                    uVar5 = 0;
                    do {
                      if (uVar21 != 0) {
                        local_60 = (uchar *)CONCAT44(local_60._4_4_,uVar5);
                        lVar19 = 0;
                        uVar22 = 0;
                        do {
                          uVar5 = cio_read(cio,(uint)(puVar15[uVar22] >> 3));
                          puVar12[uVar22] = uVar5;
                          uVar22 = uVar22 + 1;
                          lVar19 = lVar19 + -4;
                        } while (uVar21 != uVar22);
                        puVar12 = (uint *)((long)puVar12 - lVar19);
                        color = local_68;
                        uVar5 = (uint)local_60;
                      }
                      uVar5 = uVar5 + 1;
                    } while (uVar5 != local_58);
                  }
                  goto LAB_0012ba48;
                }
                goto LAB_0012ba2a;
              }
              if (local_74.type != 0x636f6c72) goto LAB_0012ba2a;
              OVar17 = local_74.init_pos;
              OVar20 = local_74.length;
              if (color->jp2_has_colr == '\0') {
                poVar2 = local_38->cinfo;
                uVar5 = cio_read(cio,1);
                poVar4->meth = uVar5;
                uVar5 = cio_read(cio,1);
                poVar4->precedence = uVar5;
                uVar5 = cio_read(cio,1);
                OVar17 = local_74.init_pos;
                OVar20 = local_74.length;
                poVar4->approx = uVar5;
                if (poVar4->meth == 2) {
                  iVar7 = local_74.length + local_74.init_pos;
                  iVar6 = cio_tell(cio);
                  uVar5 = iVar7 - iVar6;
                  if (-1 < (int)uVar5) {
                    if (uVar5 != 0) {
                      local_60 = cio_getbp(cio);
                      puVar15 = (uchar *)malloc((ulong)uVar5);
                      poVar3 = local_68;
                      local_68->icc_profile_buf = puVar15;
                      local_68->icc_profile_len = uVar5;
                      iVar6 = cio_tell(cio);
                      cio_skip(cio,iVar7 - iVar6);
                      memcpy(poVar3->icc_profile_buf,local_60,(ulong)uVar5);
                    }
                    goto LAB_0012bc5f;
                  }
                  pcVar16 = "Error with COLR box size\n";
                }
                else {
                  if (poVar4->meth == 1) {
                    uVar5 = cio_read(cio,4);
                    poVar4->enumcs = uVar5;
                  }
LAB_0012bc5f:
                  iVar6 = cio_tell(cio);
                  if (iVar6 - local_74.init_pos == local_74.length) {
                    local_68->jp2_has_colr = '\x01';
                    color = local_68;
                    goto LAB_0012ba48;
                  }
                  pcVar16 = "Error with COLR Box\n";
                  OVar17 = local_74.init_pos;
                  OVar20 = local_74.length;
                }
                opj_event_msg(poVar2,1,pcVar16);
                color = local_68;
              }
              cio_seek(cio,OVar17 + 8);
LAB_0012ba43:
              cio_skip(cio,OVar20 - 8);
            }
LAB_0012ba48:
            jp2_read_boxhdr(local_40,cio,&local_74);
            iVar7 = cio_tell(cio);
            iVar6 = local_54;
            poVar3 = local_68;
            poVar4 = local_38;
          } while (iVar7 < local_54);
        }
        cio_seek(cio,iVar6);
        return (uint)(color->jp2_has_colr == '\x01');
      }
      cinfo = jp2->cinfo;
      jp2_read_boxhdr(cinfo,cio,&local_4c);
      if (local_4c.type == 0x62706363) {
        if (jp2->numcomps != 0) {
          lVar19 = 8;
          uVar21 = 0;
          do {
            uVar5 = cio_read(cio,1);
            *(uint *)((long)&jp2->comps->depth + lVar19) = uVar5;
            uVar21 = uVar21 + 1;
            lVar19 = lVar19 + 0xc;
          } while (uVar21 < jp2->numcomps);
        }
        iVar6 = cio_tell(cio);
        if (iVar6 - local_4c.init_pos == local_4c.length) goto LAB_0012b86f;
        pcVar16 = "Error with BPCC Box\n";
      }
      else {
        pcVar16 = "Expected BPCC Marker\n";
      }
    }
    else {
      pcVar16 = "Error with IHDR Box\n";
    }
  }
  else {
    pcVar16 = "Expected IHDR Marker\n";
  }
LAB_0012bcf5:
  opj_event_msg(cinfo,1,pcVar16);
  return 0;
}

Assistant:

opj_bool jp2_read_jp2h(opj_jp2_t *jp2, opj_cio_t *cio, opj_jp2_color_t *color) 
{
	opj_jp2_box_t box;
	int jp2h_end;

	opj_common_ptr cinfo = jp2->cinfo;

	jp2_read_boxhdr(cinfo, cio, &box);
	do 
   {
	if (JP2_JP2H != box.type) 
  {
	if (box.type == JP2_JP2C) 
 {
	opj_event_msg(cinfo, EVT_ERROR, "Expected JP2H Marker\n");
	return OPJ_FALSE;
 }
	cio_skip(cio, box.length - 8);

	if(cio->bp >= cio->end) return OPJ_FALSE;

	jp2_read_boxhdr(cinfo, cio, &box);
  }
   } while(JP2_JP2H != box.type);

	if (!jp2_read_ihdr(jp2, cio))
		return OPJ_FALSE;
	jp2h_end = box.init_pos + box.length;

	if (jp2->bpc == 255) 
   {
	if (!jp2_read_bpcc(jp2, cio))
		return OPJ_FALSE;
   }
	jp2_read_boxhdr(cinfo, cio, &box);

	while(cio_tell(cio) < jp2h_end)
   {
	if(box.type == JP2_COLR)
  {
	if( !jp2_read_colr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CDEF && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cdef(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_PCLR && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_pclr(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
    if(box.type == JP2_CMAP && !jp2->ignore_pclr_cmap_cdef)
  {
    if( !jp2_read_cmap(jp2, cio, &box, color))
 {
    cio_seek(cio, box.init_pos + 8);
    cio_skip(cio, box.length - 8);
 }
    jp2_read_boxhdr(cinfo, cio, &box);
    continue;
  }
	cio_seek(cio, box.init_pos + 8);
	cio_skip(cio, box.length - 8);
	jp2_read_boxhdr(cinfo, cio, &box);

   }/* while(cio_tell(cio) < box_end) */

	cio_seek(cio, jp2h_end);

/* Part 1, I.5.3.3 : 'must contain at least one' */
	return (color->jp2_has_colr == 1);

}